

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.cpp
# Opt level: O3

string * SudoMaker::ReGlob::RegexpString
                   (string *__return_storage_ptr__,string *glob,config config,bool _is_path)

{
  byte bVar1;
  uchar uVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer puVar9;
  long *plVar10;
  pointer puVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  string error_msg;
  uint local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_e8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(1);
  local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\0';
  uVar4 = glob->_M_string_length;
  local_130 = config._0_4_;
  local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (uVar4 != 0) {
    local_b8 = (ulong)(uint5)config & 0x100000100;
    local_c0 = "\\?";
    if (((uint5)config & 0x100) != 0) {
      local_c0 = "(.)";
    }
    bVar18 = false;
    uVar13 = 0;
    do {
      pcVar5 = (glob->_M_dataplus)._M_p;
      bVar1 = pcVar5[uVar13];
      uVar2 = local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      cVar6 = (char)__return_storage_ptr__;
      if (bVar1 < 0x3d) {
        if (bVar1 < 0x2a) {
          if (((bVar1 - 0x28 < 2) || (bVar1 == 0x21)) || (bVar1 == 0x24))
          goto switchD_00107254_caseD_5e;
        }
        else if (bVar1 < 0x2c) {
          if (bVar1 == 0x2a) {
            if (((~bVar18 | _is_path) & 1U) != 0) {
              if (uVar13 == 0) {
                cVar6 = '\0';
              }
              else {
                cVar6 = pcVar5[uVar13 - 1];
                if ((_is_path & bVar18 & cVar6 != '\0') == 1) {
                  if (uVar13 == 1) {
                    cVar6 = '\0';
                  }
                  else {
                    cVar6 = pcVar5[uVar13 - 2];
                  }
                }
              }
              uVar16 = 0;
              do {
                uVar14 = uVar13;
                cVar3 = pcVar5[uVar14 + 1];
                uVar13 = uVar14 + 1;
                uVar16 = uVar16 + 1;
              } while (cVar3 == '*');
              if (((((local_130 >> 0x18 & 1) == 0) || (uVar16 < 2)) ||
                  ((cVar6 != '/' && (cVar6 != '\0')))) || ((cVar3 != '/' && (cVar3 != '\0')))) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                uVar13 = uVar14;
              }
              else {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              goto LAB_001073ef;
            }
          }
          else if (bVar1 == 0x2b) goto switchD_00107254_caseD_5e;
        }
        else if (bVar1 == 0x2c) {
          if ((bVar18 != false) || (uVar2 == '\0')) goto LAB_0010755b;
          if ((uVar2 != '\x02') && (uVar2 != '\x01')) goto LAB_001073ef;
        }
        else if (bVar1 == 0x2e) goto switchD_00107254_caseD_5e;
      }
      else {
        if (0x7a < bVar1) {
          if (bVar1 == 0x7b) {
            if (bVar18 == false) {
              if ((local_130 >> 8 & 1) != 0) {
                local_108 = (long *)CONCAT71(local_108._1_7_,2);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(&local_120,(uchar *)&local_108);
                std::__cxx11::string::push_back(cVar6);
                if (((uint5)config & 0x100000000) == 0) goto LAB_001074f8;
                goto LAB_001073f2;
              }
              std::__cxx11::string::push_back(cVar6);
            }
          }
          else {
            if (bVar1 == 0x7c) goto switchD_00107254_caseD_5e;
            if ((bVar1 == 0x7d) && (bVar18 == false)) {
              if ((uVar2 == '\x02' & config.bash_syntax & 1U) == 1) {
                local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
LAB_001074f8:
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                goto LAB_001073f2;
              }
              std::__cxx11::string::push_back(cVar6);
            }
          }
          goto LAB_001073e3;
        }
        switch(bVar1) {
        case 0x5b:
          if (!bVar18) {
            if ((local_130 >> 8 & 1) == 0) {
              std::__cxx11::string::push_back(cVar6);
            }
            else if (((uint5)config & 0x100000000) != 0) {
              lVar15 = (long)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2;
              puVar9 = local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (0 < lVar15) {
                puVar9 = local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         ((long)local_120.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_120.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffffc);
                lVar15 = lVar15 + 1;
                puVar11 = local_120.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + 3;
                do {
                  if (puVar11[-3] == '\x01') {
                    puVar11 = puVar11 + -3;
                    goto LAB_001076aa;
                  }
                  if (puVar11[-2] == '\x01') {
                    puVar11 = puVar11 + -2;
                    goto LAB_001076aa;
                  }
                  if (puVar11[-1] == '\x01') {
                    puVar11 = puVar11 + -1;
                    goto LAB_001076aa;
                  }
                  if (*puVar11 == '\x01') goto LAB_001076aa;
                  lVar15 = lVar15 + -1;
                  puVar11 = puVar11 + 4;
                } while (1 < lVar15);
              }
              lVar15 = (long)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar9;
              if (lVar15 == 1) {
LAB_0010768f:
                puVar11 = puVar9;
                if (*puVar9 != '\x01') {
                  puVar11 = local_120.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                }
LAB_001076aa:
                if (puVar11 !=
                    local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
                  local_50[0] = local_40;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_50,
                             "ReGlob: Cannot group square bracket inside square brackets.","");
                  *puVar8 = &PTR__reglob_error_0011dbd8;
                  puVar8[1] = puVar8 + 3;
                  puVar8[2] = 0;
                  *(undefined1 *)(puVar8 + 3) = 0;
                  std::__cxx11::string::operator=((string *)(puVar8 + 1),(string *)local_50);
                  __cxa_throw(puVar8,&reglob_error::typeinfo,reglob_error::~reglob_error);
                }
              }
              else {
                if (lVar15 == 2) {
LAB_00107687:
                  puVar11 = puVar9;
                  if (*puVar9 != '\x01') {
                    puVar9 = puVar9 + 1;
                    goto LAB_0010768f;
                  }
                  goto LAB_001076aa;
                }
                if (lVar15 == 3) {
                  puVar11 = puVar9;
                  if (*puVar9 != '\x01') {
                    puVar9 = puVar9 + 1;
                    goto LAB_00107687;
                  }
                  goto LAB_001076aa;
                }
              }
              std::__cxx11::string::push_back(cVar6);
              local_108 = (long *)CONCAT71(local_108._1_7_,1);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(&local_120,(uchar *)&local_108);
            }
          }
          break;
        case 0x5c:
          if (bVar18 != false) goto LAB_0010755b;
          bVar18 = true;
          goto LAB_001073f2;
        case 0x5d:
          if (bVar18 != false) break;
          if ((local_130 >> 8 & 1) != 0) {
            if (((uint5)config & 0x100000000) == 0) break;
            if (uVar2 == '\x01') {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
              goto LAB_001073ef;
            }
          }
LAB_0010755b:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_001073ef;
        default:
          if (bVar1 != 0x3d) {
            if (((bVar1 == 0x3f) && (bVar18 == false)) && (local_b8 != 0x100)) goto LAB_0010755b;
            break;
          }
        case 0x5e:
switchD_00107254_caseD_5e:
          if (bVar18 == false) {
            std::__cxx11::string::push_back(cVar6);
          }
        }
      }
LAB_001073e3:
      std::__cxx11::string::push_back(cVar6);
LAB_001073ef:
      bVar18 = false;
LAB_001073f2:
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar4);
    if (bVar18 != false) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"ReGlob: Escape at the end of line.","");
      *puVar8 = &PTR__reglob_error_0011dbd8;
      puVar8[1] = puVar8 + 3;
      puVar8[2] = 0;
      *(undefined1 *)(puVar8 + 3) = 0;
      std::__cxx11::string::operator=((string *)(puVar8 + 1),(string *)local_70);
      __cxa_throw(puVar8,&reglob_error::typeinfo,reglob_error::~reglob_error);
    }
  }
  uVar2 = local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (uVar2 == '\0') {
    if ((local_130 >> 0x10 & 1) != 0) {
      std::operator+(&local_e0,"^",__return_storage_ptr__);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_f8 = *plVar10;
        lStack_f0 = plVar7[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *plVar10;
        local_108 = (long *)*plVar7;
      }
      local_100 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_108);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  pcVar17 = "}";
  if (uVar2 == '\x01') {
    pcVar17 = "]";
  }
  pcVar12 = "";
  if (uVar2 == '\x01') {
    pcVar12 = "";
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar17,pcVar12);
  std::operator+(&local_e0,"ReGlob: unmatched ",&local_b0);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_108 = (long *)*plVar7;
  plVar10 = plVar7 + 2;
  if (local_108 == plVar10) {
    local_f8 = *plVar10;
    lStack_f0 = plVar7[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *plVar10;
  }
  local_100 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_108,local_100 + (long)local_108);
  *puVar8 = &PTR__reglob_error_0011dbd8;
  puVar8[1] = puVar8 + 3;
  puVar8[2] = 0;
  *(undefined1 *)(puVar8 + 3) = 0;
  std::__cxx11::string::operator=((string *)(puVar8 + 1),(string *)local_90);
  __cxa_throw(puVar8,&reglob_error::typeinfo,reglob_error::~reglob_error);
}

Assistant:

std::string ReGlob::RegexpString(const std::string &glob, ReGlob::config config, bool _is_path) {
	enum domains {
		DOMAIN_NONE = 0, DOMAIN_SQUARE_BRACKET = 1, DOMAIN_BRACES = 2
	};

	std::string regexp_str;

	bool escaped = false;

	std::vector<uint8_t> domain(1, DOMAIN_NONE);

	char c;
	uint8_t current_domain;
	for (size_t i = 0, len = glob.size(); i < len; i++) {
		c = glob[i];

		current_domain = domain.back();

		switch (c) {
			case '\\':
				if (escaped) {
					escaped = false;
					regexp_str += "\\\\";
				} else {
					escaped = true;
				}
				break;
			case '$':
			case '^':
			case '+':
			case '.':
			case '(':
			case ')':
			case '=':
			case '!':
			case '|':
				if (!escaped) {
					regexp_str += '\\';
				}
				regexp_str += c;
				escaped = false;
				break;
			case '?':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							regexp_str += "(.)";
						} else {
							regexp_str += '.';
						}
					} else {
						regexp_str += "\\?";
					}
				}
				escaped = false;
				break;

			case '[':
				if (!escaped) {
					if (config.bash_syntax) {
						if (config.capture) {
							if (std::find(domain.begin(), domain.end(), DOMAIN_SQUARE_BRACKET) != domain.end()) {
								throw reglob_error("ReGlob: Cannot group square bracket inside square brackets.");
							}
							regexp_str += '(';
							domain.push_back(DOMAIN_SQUARE_BRACKET);
						}
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ']':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							if (current_domain == DOMAIN_SQUARE_BRACKET) {
								regexp_str += "])";
								domain.pop_back();
							} else {
								regexp_str += "\\]";
							}
						} else {
							regexp_str += c;
						}
					} else {
						regexp_str += "\\]";
					}
				}
				escaped = false;
				break;

			case '{':
				if (!escaped) {
					if (config.bash_syntax) {
						domain.push_back(DOMAIN_BRACES);
						regexp_str += '(';
						if (!config.capture) {
							regexp_str += "?:";
						}
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case '}':
				if (!escaped) {
					if (current_domain == DOMAIN_BRACES && config.bash_syntax) {
						domain.pop_back();
						regexp_str += ")";
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ',':
				if (!escaped && current_domain != DOMAIN_NONE) {
					if (current_domain == DOMAIN_BRACES) regexp_str += '|';
					else if (current_domain == DOMAIN_SQUARE_BRACKET) regexp_str += c;
				} else {
					regexp_str += "\\,";
				}
				escaped = false;
				break;

			case '*': {
				if (escaped && !_is_path) {
					regexp_str += c;
				} else {
					char prev_char = i ? glob[i - 1] : 0;
					if (prev_char && _is_path && escaped) {
						prev_char = i - 1 ? glob[i - 2] : 0;
					}

					size_t star_cnt = 1;
					while (glob[i + 1] == '*') {
						star_cnt++;
						i++;
					}
					char next_char = glob[i + 1];

					if (!config.globstars) {
						if (config.capture && !escaped) {
							regexp_str += "(.*)";
						} else {
							regexp_str += ".*";
						}
					} else {
						if (star_cnt > 1 && (prev_char == '/' || !prev_char) && (next_char == '/' || !next_char)) {
							if (config.capture && !escaped) {
								regexp_str += "((?:[^/]*(?:/|$))*)";
							} else {
								regexp_str += "(?:[^/]*(?:/|$))*";
							}
							i++;
						} else {
							if (config.capture && !escaped) {
								regexp_str += "([^/]*)";
							} else {
								regexp_str += "[^/]*";
							}
						}
					}
				}
				escaped = false;
				break;
			}
			default:
				regexp_str += c;
				escaped = false;
		}
	}

	current_domain = domain.back();

	if (escaped) {
		throw reglob_error("ReGlob: Escape at the end of line.");
	}
	if (current_domain != DOMAIN_NONE) {
//			printf("Current domain: %d\n", current_domain);
		std::string error_msg = "ReGlob: unmatched " + std::string(current_domain == DOMAIN_SQUARE_BRACKET ? "]" : "}") + " in glob expression";
		throw reglob_error(error_msg);
	}

	if (config.full_match) {
		regexp_str = "^" + regexp_str + "$";
	}

	return regexp_str;
}